

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool __thiscall
GEO::Delaunay2d::create_first_triangle(Delaunay2d *this,index_t *iv0,index_t *iv1,index_t *iv2)

{
  char cVar1;
  index_t iVar2;
  index_t iVar3;
  int iVar4;
  int iVar5;
  double *pdVar6;
  pointer piVar7;
  uint uVar8;
  Sign SVar9;
  index_t iVar10;
  index_t iVar11;
  index_t *piVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  index_t e;
  long lVar16;
  bool bVar17;
  index_t t [3];
  index_t aiStack_3c [3];
  
  if ((this->super_Delaunay).nb_vertices_ < 3) {
    bVar17 = false;
  }
  else {
    *iv0 = 0;
    *iv1 = 1;
    uVar15 = (this->super_Delaunay).nb_vertices_;
    uVar8 = 1;
    if (1 < uVar15) {
      pdVar6 = (this->super_Delaunay).vertices_;
      uVar13 = (this->super_Delaunay).vertex_stride_;
      uVar14 = *iv0 * uVar13;
      while( true ) {
        if ((((pdVar6[uVar14] != pdVar6[uVar13]) || (NAN(pdVar6[uVar14]) || NAN(pdVar6[uVar13]))) ||
            (pdVar6[(ulong)uVar14 + 1] != pdVar6[(ulong)uVar13 + 1])) ||
           (NAN(pdVar6[(ulong)uVar14 + 1]) || NAN(pdVar6[(ulong)uVar13 + 1]))) break;
        uVar8 = uVar8 + 1;
        *iv1 = uVar8;
        uVar15 = (this->super_Delaunay).nb_vertices_;
        if (uVar15 <= uVar8) break;
        iVar11 = (this->super_Delaunay).vertex_stride_;
        uVar14 = *iv0 * iVar11;
        uVar13 = iVar11 * uVar8;
      }
    }
    if (uVar8 == uVar15) {
      bVar17 = false;
    }
    else {
      pdVar6 = (this->super_Delaunay).vertices_;
      piVar12 = iv1;
      do {
        uVar8 = *piVar12 + 1;
        *iv2 = uVar8;
        uVar15 = (this->super_Delaunay).nb_vertices_;
        if (uVar15 <= uVar8) {
          SVar9 = ZERO;
          break;
        }
        iVar11 = (this->super_Delaunay).vertex_stride_;
        SVar9 = PCK::orient_2d(pdVar6 + *iv0 * iVar11,pdVar6 + *iv1 * iVar11,pdVar6 + iVar11 * uVar8
                              );
        piVar12 = iv2;
      } while (SVar9 == ZERO);
      bVar17 = uVar8 != uVar15;
      if (bVar17) {
        if (SVar9 == NEGATIVE) {
          iVar11 = *iv1;
          *iv1 = uVar8;
          *iv2 = iVar11;
        }
        iVar11 = *iv0;
        iVar2 = *iv1;
        iVar3 = *iv2;
        iVar10 = new_triangle(this);
        uVar15 = iVar10 * 3;
        piVar7 = (this->cell_to_v_store_).
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar7[uVar15] = iVar11;
        piVar7[(ulong)iVar10 * 3 + 1 & 0xffffffff] = iVar2;
        piVar7[iVar10 * 3 + 2] = iVar3;
        lVar16 = 0;
        do {
          piVar7 = (this->cell_to_v_store_).
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          iVar4 = piVar7[(int)(char)(&DAT_001aa8e6)[lVar16 * 2] + uVar15];
          iVar5 = piVar7[(int)(char)(&triangle_edge_vertex_)[lVar16 * 2] + uVar15];
          iVar11 = new_triangle(this);
          piVar7 = (this->cell_to_v_store_).
                   super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                   super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                   super__Vector_impl_data._M_start;
          piVar7[iVar11 * 3] = -1;
          piVar7[iVar11 * 3 + 1] = iVar4;
          piVar7[iVar11 * 3 + 2] = iVar5;
          aiStack_3c[lVar16] = iVar11;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        piVar7 = (this->cell_to_cell_store_).
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = 0;
        do {
          iVar11 = aiStack_3c[lVar16];
          piVar7[iVar11 * 3] = iVar10;
          piVar7[uVar15 + (int)lVar16] = iVar11;
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        piVar7 = (this->cell_to_cell_store_).
                 super_vector<int,_GEO::Memory::aligned_allocator<int,_64>_>.
                 super__Vector_base<int,_GEO::Memory::aligned_allocator<int,_64>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar16 = 0;
        do {
          cVar1 = (&triangle_edge_vertex_)[lVar16 * 2];
          iVar11 = aiStack_3c[lVar16];
          piVar7[iVar11 * 3 + 1] = aiStack_3c[(uint)(int)(char)(&DAT_001aa8e6)[lVar16 * 2]];
          piVar7[iVar11 * 3 + 2] = aiStack_3c[(long)cVar1 & 0xffffffff];
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
        bVar17 = true;
      }
    }
  }
  return bVar17;
}

Assistant:

bool Delaunay2d::create_first_triangle(
        index_t& iv0, index_t& iv1, index_t& iv2
    ) {
        if(nb_vertices() < 3) {
            return false;
        }

        iv0 = 0;

        iv1 = 1;
        while(
            iv1 < nb_vertices() &&
            PCK::points_are_identical_2d(
                vertex_ptr(iv0), vertex_ptr(iv1)
            )
        ) {
            ++iv1;
        }
        if(iv1 == nb_vertices()) {
            return false;
        }

        iv2 = iv1 + 1;
	Sign s = ZERO;
        while(
            iv2 < nb_vertices() &&  
	    (s = PCK::orient_2d(vertex_ptr(iv0), vertex_ptr(iv1), vertex_ptr(iv2))) == ZERO
	) {
            ++iv2;
        }
        if(iv2 == nb_vertices()) {
            return false;
        }
	if(s == NEGATIVE) {
	    std::swap(iv1,iv2);
	}
	    
        // Create the first triangle
        index_t t0 = new_triangle(
            signed_index_t(iv0), 
            signed_index_t(iv1), 
            signed_index_t(iv2)
        );

        // Create the first three virtual triangles surrounding it
        index_t t[3];
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            signed_index_t v1 = triangle_vertex(t0, triangle_edge_vertex(e,1));
            signed_index_t v2 = triangle_vertex(t0, triangle_edge_vertex(e,0));
            t[e] = new_triangle(VERTEX_AT_INFINITY, v1, v2);
        }

        // Connect the virtual triangles to the real one
        for(index_t e=0; e<3; ++e) {
            set_triangle_adjacent(t[e], 0, t0);
            set_triangle_adjacent(t0, e, t[e]);
        }

        // Interconnect the three virtual triangles along their common
        // edges
        for(index_t e = 0; e < 3; ++e) {
            // In reverse order since it is an adjacent tetrahedron
            index_t lv1 = triangle_edge_vertex(e,1);
            index_t lv2 = triangle_edge_vertex(e,0);
            set_triangle_adjacent(t[e], 1, t[lv1]);
            set_triangle_adjacent(t[e], 2, t[lv2]);
        }

        return true;
    }